

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::NumLayersTest::build(NumLayersTest *this,FboBuilder *builder)

{
  GLenum GVar1;
  GLuint GVar2;
  Texture *texCfg;
  ImageFormat IVar3;
  Attachment *att;
  
  GVar1 = (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.textureKind;
  if (GVar1 == 0x8c1a) {
    texCfg = (Texture *)
             deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture2DArray>
                       (builder);
  }
  else if (GVar1 == 0x806f) {
    texCfg = (Texture *)
             deqp::gls::FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture3D>
                       (builder);
  }
  else {
    texCfg = (Texture *)0x0;
  }
  IVar3 = deqp::gls::fboc::details::TestBase::getDefaultFormat((TestBase *)this,0x8ce0,0x1702);
  (texCfg->super_Image).internalFormat = IVar3;
  (texCfg->super_Image).width = 0x40;
  (texCfg->super_Image).height = 0x40;
  *(GLsizei *)&texCfg->field_0x1c =
       (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.numLayers;
  GVar2 = deqp::gls::FboUtil::FboBuilder::glCreateTexture(builder,texCfg);
  att = (Attachment *)
        deqp::gls::FboUtil::FboBuilder::
        makeConfig<deqp::gls::FboUtil::config::TextureLayerAttachment>(builder);
  *(GLsizei *)((long)&att[1].super_Config._vptr_Config + 4) =
       (this->super_ParamTest<deqp::gles3::Functional::NumLayersParams>).m_params.attachmentLayer;
  att->imageName = GVar2;
  deqp::gls::FboUtil::FboBuilder::glAttach(builder,0x8ce0,att);
  return STOP;
}

Assistant:

IterateResult NumLayersTest::build (FboBuilder& builder)
{
	TextureLayered* texCfg = DE_NULL;
	const GLenum target = GL_COLOR_ATTACHMENT0;

	switch (m_params.textureKind)
	{
		case GL_TEXTURE_3D:
			texCfg = &builder.makeConfig<Texture3D>();
			break;
		case GL_TEXTURE_2D_ARRAY:
			texCfg = &builder.makeConfig<Texture2DArray>();
			break;
		default:
			DE_FATAL("Impossible case");
	}
	texCfg->internalFormat = getDefaultFormat(target, GL_TEXTURE);
	texCfg->width = 64;
	texCfg->height = 64;
	texCfg->numLayers = m_params.numLayers;
	const GLuint tex = builder.glCreateTexture(*texCfg);

	TextureLayerAttachment* att = &builder.makeConfig<TextureLayerAttachment>();
	att->layer = m_params.attachmentLayer;
	att->imageName = tex;

	builder.glAttach(target, att);

	return STOP;
}